

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O2

mbedtls_mpi_uint
mbedtls_mpi_core_add(mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint *B,size_t limbs)

{
  ulong uVar1;
  size_t i;
  size_t sVar2;
  mbedtls_mpi_uint mVar3;
  
  mVar3 = 0;
  for (sVar2 = 0; limbs != sVar2; sVar2 = sVar2 + 1) {
    uVar1 = mVar3 + A[sVar2];
    mVar3 = (ulong)CARRY8(uVar1,B[sVar2]) + (ulong)CARRY8(mVar3,A[sVar2]);
    X[sVar2] = uVar1 + B[sVar2];
  }
  return mVar3;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_add(mbedtls_mpi_uint *X,
                                      const mbedtls_mpi_uint *A,
                                      const mbedtls_mpi_uint *B,
                                      size_t limbs)
{
    mbedtls_mpi_uint c = 0;

    for (size_t i = 0; i < limbs; i++) {
        mbedtls_mpi_uint t = c + A[i];
        c = (t < A[i]);
        t += B[i];
        c += (t < B[i]);
        X[i] = t;
    }

    return c;
}